

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileDescriptor *file_00;
  Printer *printer_00;
  bool bVar1;
  int iVar2;
  string *filename_00;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar3;
  LogMessage *pLVar4;
  Printer local_1e8 [8];
  Printer printer;
  LogFinisher local_19a;
  byte local_199;
  LogMessage local_198 [56];
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_160;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  FileDescriptorProto fdp;
  string local_88 [8];
  string filename;
  undefined1 local_58 [8];
  string module_name;
  MutexLock lock;
  string *error_local;
  GeneratorContext *context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  internal::MutexLock::MutexLock((MutexLock *)((long)&module_name.field_2 + 8),&this->mutex_);
  this->file_ = file;
  filename_00 = FileDescriptor::name_abi_cxx11_(file);
  anon_unknown_0::ModuleName((string *)local_58,filename_00);
  std::__cxx11::string::string(local_88,(string *)local_58);
  google::protobuf::StripString(local_88,".",'/');
  std::__cxx11::string::operator+=(local_88,".py");
  google::protobuf::FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&output);
  google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)this->file_);
  google::protobuf::MessageLite::SerializeToString((string *)&output);
  iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_88);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
            (&local_160,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2));
  local_199 = 0;
  pZVar3 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_160);
  if (pZVar3 == (ZeroCopyOutputStream *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_198,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x10f);
    local_199 = 1;
    pLVar4 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_198,"CHECK failed: output.get(): ");
    google::protobuf::internal::LogFinisher::operator=(&local_19a,pLVar4);
  }
  if ((local_199 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(local_198);
  }
  pZVar3 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_160);
  google::protobuf::io::Printer::Printer(local_1e8,pZVar3,'$');
  this->printer_ = local_1e8;
  file_00 = this->file_;
  printer_00 = this->printer_;
  bVar1 = GeneratingDescriptorProto(this);
  anon_unknown_0::PrintTopBoilerplate(printer_00,file_00,bVar1);
  PrintImports(this);
  PrintFileDescriptor(this);
  PrintTopLevelEnums(this);
  PrintTopLevelExtensions(this);
  PrintAllNestedEnumsInFile(this);
  PrintMessageDescriptors(this);
  FixForeignFieldsInDescriptors(this);
  PrintMessages(this);
  FixForeignFieldsInExtensions(this);
  FixAllDescriptorOptions(this);
  bVar1 = anon_unknown_0::HasGenericServices(file);
  if (bVar1) {
    PrintServices(this);
  }
  google::protobuf::io::Printer::Print((char *)local_1e8);
  bVar1 = io::Printer::failed(local_1e8);
  google::protobuf::io::Printer::~Printer(local_1e8);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_160);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&output);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_58);
  internal::MutexLock::~MutexLock((MutexLock *)((long)&module_name.field_2 + 8));
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const string& parameter,
                         GeneratorContext* context,
                         string* error) const {

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  string module_name = ModuleName(file->name());
  string filename = module_name;
  StripString(&filename, ".", '/');
  filename += ".py";

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  PrintImports();
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  PrintAllNestedEnumsInFile();
  PrintMessageDescriptors();
  FixForeignFieldsInDescriptors();
  PrintMessages();
  // We have to fix up the extensions after the message classes themselves,
  // since they need to call static RegisterExtension() methods on these
  // classes.
  FixForeignFieldsInExtensions();
  // Descriptor options may have custom extensions. These custom options
  // can only be successfully parsed after we register corresponding
  // extensions. Therefore we parse all options again here to recognize
  // custom options that may be unknown when we define the descriptors.
  FixAllDescriptorOptions();
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print(
    "# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}